

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

CodeLocationRange *
soul::SourceCodeUtilities::findRangeOfASTObject
          (CodeLocationRange *__return_storage_ptr__,ASTObject *object)

{
  CodeLocation *pCVar1;
  undefined1 local_40 [8];
  FindLexicalRangeVisitor v;
  ASTObject *object_local;
  
  v.range.end.location.data = (char *)object;
  findRangeOfASTObject::FindLexicalRangeVisitor::FindLexicalRangeVisitor
            ((FindLexicalRangeVisitor *)local_40);
  pCVar1 = CodeLocation::operator=
                     ((CodeLocation *)&v.range.start.location,
                      (CodeLocation *)(v.range.end.location.data + 0x10));
  CodeLocation::operator=((CodeLocation *)&v,pCVar1);
  findRangeOfASTObject(soul::AST::ASTObject&)::FindLexicalRangeVisitor::visitObject(soul::AST::
  ASTObject__(local_40,(ASTObject *)v.range.end.location.data);
  CodeLocationRange::CodeLocationRange(__return_storage_ptr__,(CodeLocationRange *)&v);
  findRangeOfASTObject::FindLexicalRangeVisitor::~FindLexicalRangeVisitor
            ((FindLexicalRangeVisitor *)local_40);
  return __return_storage_ptr__;
}

Assistant:

CodeLocationRange SourceCodeUtilities::findRangeOfASTObject (AST::ASTObject& object)
{
    struct FindLexicalRangeVisitor  : public ASTVisitor
    {
        void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto loc = o.context.location;

            if (loc.location < range.start.location)  range.start = loc;
            if (loc.location > range.end.location)    range.end = loc;
        }

        CodeLocationRange range;
    };

    FindLexicalRangeVisitor v;
    v.range.start = v.range.end = object.context.location;
    v.visitObject (object);
    return v.range;
}